

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

App * __thiscall CLI::App::excludes(App *this,App *app)

{
  OptionNotFound *pOVar1;
  pair<std::_Rb_tree_iterator<CLI::App_*>,_bool> pVar2;
  App *local_70;
  App *local_68;
  string local_60;
  string local_40;
  
  local_70 = app;
  if (app == (App *)0x0) {
    pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nullptr passed","");
    OptionNotFound::OptionNotFound(pOVar1,&local_40);
    __cxa_throw(pOVar1,&OptionNotFound::typeinfo,Error::~Error);
  }
  if (app != this) {
    pVar2 = ::std::
            _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
            ::_M_insert_unique<CLI::App*const&>
                      ((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                        *)&this->exclude_subcommands_,&local_70);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_68 = this;
      ::std::
      _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
      ::_M_insert_unique<CLI::App*>
                ((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                  *)&local_70->exclude_subcommands_,&local_68);
    }
    return this;
  }
  pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"cannot self reference in needs","");
  OptionNotFound::OptionNotFound(pOVar1,&local_60);
  __cxa_throw(pOVar1,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

App *excludes(App *app) {
        if(app == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        if(app == this) {
            throw OptionNotFound("cannot self reference in needs");
        }
        auto res = exclude_subcommands_.insert(app);
        // subcommand exclusion should be symmetric
        if(res.second) {
            app->exclude_subcommands_.insert(this);
        }
        return this;
    }